

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cborencoder.c
# Opt level: O3

CborError create_container(CborEncoder *encoder,CborEncoder *container,size_t length,
                          uint8_t shiftedMajorType)

{
  uint8_t *puVar1;
  ulong uVar2;
  CborError CVar3;
  char cVar4;
  byte bVar5;
  long lVar6;
  void *__src;
  uint8_t *puVar7;
  uint8_t *puVar8;
  undefined8 local_20;
  uint8_t auStack_18 [8];
  
  container->data = encoder->data;
  puVar1 = encoder->end;
  container->end = puVar1;
  encoder->added = encoder->added + 1;
  container->added = 0;
  container->flags = shiftedMajorType & 0x20;
  if (length == 0xffffffffffffffff) {
    container->flags = shiftedMajorType & 0x20 | 4;
    if (puVar1 == (uint8_t *)0x0) {
      puVar8 = (container->data).ptr;
      if (-1 < (long)puVar8) {
        lVar6 = 1;
        goto LAB_00102dad;
      }
    }
    else {
      puVar8 = (container->data).ptr;
      if (-1 < (long)puVar8 - (long)puVar1) {
        lVar6 = ((long)puVar8 - (long)puVar1) + 1;
        container->end = (uint8_t *)0x0;
        puVar8 = (uint8_t *)0x0;
LAB_00102dad:
        puVar8 = puVar8 + lVar6;
        CVar3 = CborErrorOutOfMemory;
        goto LAB_00102dc4;
      }
    }
    *puVar8 = shiftedMajorType + '\x1f';
    puVar8 = (uint8_t *)((container->data).bytes_needed + 1);
    CVar3 = CborNoError;
LAB_00102dc4:
    (container->data).ptr = puVar8;
    return CVar3;
  }
  __src = (void *)((long)&local_20 + 7);
  uVar2 = length >> 0x38 | (length & 0xff000000000000) >> 0x28 | (length & 0xff0000000000) >> 0x18 |
          (length & 0xff00000000) >> 8 | (length & 0xff000000) << 8 | (length & 0xff0000) << 0x18 |
          (length & 0xff00) << 0x28;
  local_20 = uVar2 | length << 0x38;
  if (length < 0x18) {
    local_20 = CONCAT17((char)length + shiftedMajorType,(int7)uVar2);
  }
  else {
    cVar4 = '\x02';
    if (length < 0x10000) {
      cVar4 = 0xff < length;
    }
    bVar5 = (cVar4 + '\x01') - (length >> 0x20 == 0);
    lVar6 = -1L << (bVar5 & 0x3f);
    __src = (void *)((long)__src + lVar6);
    auStack_18[lVar6 + -1] = bVar5 + shiftedMajorType + '\x18';
  }
  puVar8 = auStack_18 + -(long)__src;
  if (puVar1 == (uint8_t *)0x0) {
    puVar7 = (container->data).ptr;
    if (-1 < (long)(puVar7 + (long)(puVar8 + -1))) goto LAB_00102d81;
  }
  else {
    puVar7 = (container->data).ptr;
    if ((long)puVar1 - (long)(puVar8 + (long)puVar7) < 0) {
      puVar8 = puVar7 + ((long)puVar8 - (long)puVar1);
      container->end = (uint8_t *)0x0;
      puVar7 = (uint8_t *)0x0;
LAB_00102d81:
      puVar7 = puVar7 + (long)puVar8;
      CVar3 = CborErrorOutOfMemory;
      goto LAB_00102d9b;
    }
  }
  memcpy(puVar7,__src,(size_t)puVar8);
  puVar7 = puVar8 + (long)(container->data).ptr;
  CVar3 = CborNoError;
LAB_00102d9b:
  (container->data).ptr = puVar7;
  return CVar3;
}

Assistant:

__attribute__((noinline))
#endif
static CborError create_container(CborEncoder *encoder, CborEncoder *container, size_t length, uint8_t shiftedMajorType)
{
    CborError err;
    container->data.ptr = encoder->data.ptr;
    container->end = encoder->end;
    ++encoder->added;
    container->added = 0;

    cbor_static_assert(((MapType << MajorTypeShift) & CborIteratorFlag_ContainerIsMap) == CborIteratorFlag_ContainerIsMap);
    cbor_static_assert(((ArrayType << MajorTypeShift) & CborIteratorFlag_ContainerIsMap) == 0);
    container->flags = shiftedMajorType & CborIteratorFlag_ContainerIsMap;

    if (length == CborIndefiniteLength) {
        container->flags |= CborIteratorFlag_UnknownLength;
        err = append_byte_to_buffer(container, shiftedMajorType + IndefiniteLength);
    } else {
        err = encode_number_no_update(container, length, shiftedMajorType);
    }
    return err;
}